

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::GetRelationship(Prim *prim,string *rel_name,Relationship *out_rel,string *err)

{
  bool bVar1;
  ostream *poVar2;
  string *args;
  ostringstream ss_e_1;
  Property prop;
  string local_7c8;
  long *local_7a8 [2];
  long local_798 [2];
  long *local_788 [2];
  long local_778 [12];
  ios_base local_718 [264];
  undefined1 local_610 [684];
  Type local_364;
  Type local_360;
  Path local_358;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_288;
  ListEditQual local_270;
  AttrMetas local_268;
  bool local_60;
  
  if (out_rel == (Relationship *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_610,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetRelationship",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x7fe);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_610,"`out_rel` argument is nullptr.",0x1e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_788[0]);
      if (local_788[0] != local_778) {
        operator_delete(local_788[0],local_778[0] + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
    ::std::ios_base::~ios_base((ios_base *)(local_610 + 0x70));
  }
  else {
    Property::Property((Property *)local_610);
    args = err;
    bVar1 = GetProperty(prim,rel_name,(Property *)local_610,err);
    if (bVar1) {
      if ((local_364 & ~Attrib) == Relation) {
        out_rel->type = local_360;
        Path::operator=(&out_rel->targetPath,&local_358);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&out_rel->targetPathVector,&local_288);
        out_rel->listOpQual = local_270;
        AttrMetas::operator=(&out_rel->_metas,&local_268);
        out_rel->_varying_authored = local_60;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_788,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_788,"GetRelationship",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"():",3);
      poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_788,0x80b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      local_7a8[0] = local_798;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7a8,"{} is not a Relationship.","");
      fmt::format<std::__cxx11::string>
                (&local_7c8,(fmt *)local_7a8,(string *)rel_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_788,local_7c8._M_dataplus._M_p,local_7c8._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if (local_7a8[0] != local_798) {
        operator_delete(local_7a8[0],local_798[0] + 1);
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_7c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
      ::std::ios_base::~ios_base(local_718);
    }
    Property::~Property((Property *)local_610);
  }
  return false;
}

Assistant:

bool GetRelationship(const tinyusdz::Prim &prim, const std::string &rel_name,
                     Relationship *out_rel, std::string *err) {
  if (!out_rel) {
    PUSH_ERROR_AND_RETURN("`out_rel` argument is nullptr.");
  }

  // First lookup as Property, then check if its Relationship
  Property prop;
  if (!GetProperty(prim, rel_name, &prop, err)) {
    return false;
  }

  if (prop.is_relationship()) {
    (*out_rel) = std::move(prop.get_relationship());
  }

  PUSH_ERROR_AND_RETURN(fmt::format("{} is not a Relationship.", rel_name));

  return true;
}